

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

void Rml::StringUtilities::TrimTrailingDotZeros(String *string)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = string->_M_string_length;
  uVar3 = uVar2;
  do {
    uVar4 = uVar3;
    uVar3 = uVar4 - 1;
    if (uVar2 <= uVar3) goto LAB_0026518f;
    cVar1 = (string->_M_dataplus)._M_p[uVar4 - 1];
  } while (cVar1 == '0');
  if (cVar1 == '.') {
    uVar4 = uVar3;
  }
LAB_0026518f:
  if (uVar4 < uVar2) {
    ::std::__cxx11::string::resize((ulong)string,(char)uVar4);
    return;
  }
  return;
}

Assistant:

void StringUtilities::TrimTrailingDotZeros(String& string)
{
	size_t new_size = string.size();
	for (size_t i = string.size() - 1; i < string.size(); i--)
	{
		if (string[i] == '.')
		{
			new_size = i;
			break;
		}
		else if (string[i] == '0')
			new_size = i;
		else
			break;
	}

	if (new_size < string.size())
		string.resize(new_size);
}